

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

void snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *in_RCX;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  int tmp_n;
  char *defsep;
  int classes;
  int n;
  int i;
  canid_t mask;
  canid_t class;
  undefined4 in_stack_ffffffffffffffb8;
  char *len_00;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  int local_30;
  int local_2c;
  char *local_20;
  
  local_30 = 0;
  iVar5 = 0;
  len_00 = ",";
  if ((*in_RDX & 0x20000000) != 0) {
    uVar1 = *in_RDX & 0x1fffffff;
    if (uVar1 < 0x201) {
      local_20 = in_RCX;
      if (in_RCX == (char *)0x0) {
        local_20 = ",";
      }
      for (local_2c = 0; local_2c < 9; local_2c = local_2c + 1) {
        uVar2 = 1 << ((byte)local_2c & 0x1f);
        if ((uVar1 & uVar2) != 0) {
          if (iVar5 != 0) {
            iVar3 = snprintf((char *)(in_RDI + local_30),in_RSI - local_30,"%s",local_20);
            if (iVar3 < 0) {
              return;
            }
            if ((ulong)(in_RSI - local_30) <= (ulong)(long)iVar3) {
              return;
            }
            local_30 = iVar3 + local_30;
          }
          iVar3 = snprintf((char *)(in_RDI + local_30),in_RSI - local_30,"%s",
                           error_classes[local_2c]);
          if (iVar3 < 0) {
            return;
          }
          if ((ulong)(in_RSI - local_30) <= (ulong)(long)iVar3) {
            return;
          }
          local_30 = iVar3 + local_30;
          if (uVar2 == 2) {
            iVar4 = snprintf_error_lostarb
                              ((char *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),(size_t)len_00,
                               (canfd_frame *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
            local_30 = iVar4 + local_30;
          }
          if (uVar2 == 4) {
            iVar4 = snprintf_error_ctrl((char *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),
                                        (size_t)len_00,
                                        (canfd_frame *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
            local_30 = iVar4 + local_30;
          }
          if (uVar2 == 8) {
            iVar3 = snprintf_error_prot((char *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),
                                        (size_t)len_00,
                                        (canfd_frame *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
            local_30 = iVar3 + local_30;
          }
          iVar5 = iVar5 + 1;
        }
      }
      if ((((*in_RDX & 0x200) != 0) || (*(char *)((long)in_RDX + 0xe) != '\0')) ||
         (*(char *)((long)in_RDX + 0xf) != '\0')) {
        iVar5 = snprintf((char *)(in_RDI + local_30),in_RSI - local_30,"%s",local_20);
        snprintf((char *)(in_RDI + (iVar5 + local_30)),in_RSI - (iVar5 + local_30),
                 "error-counter-tx-rx{{%d}{%d}}",(ulong)*(byte *)((long)in_RDX + 0xe),
                 (ulong)*(byte *)((long)in_RDX + 0xf));
      }
    }
    else {
      fprintf(_stderr,"Error class %#x is invalid\n",(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes){
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n){
					return;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n){
				return;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			classes++;
		}
	}

	if (cf->can_id & CAN_ERR_CNT || cf->data[6] || cf->data[7]) {
		n += snprintf(buf + n, len - n, "%s", sep);
		n += snprintf(buf + n, len - n, "error-counter-tx-rx{{%d}{%d}}",
			      cf->data[6], cf->data[7]);
	}
}